

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
fmt::v10::
make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
          (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,v10 *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  undefined1 local_189;
  char *local_188;
  size_t local_180;
  undefined1 local_173;
  undefined1 local_172;
  undefined1 local_171;
  bool formattable_2;
  bool formattable_pointer_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_170;
  bool formattable_char_2;
  char *local_168 [3];
  undefined1 local_149;
  char *local_148;
  size_t local_140;
  undefined1 local_133;
  undefined1 local_132;
  undefined1 local_131;
  bool formattable_1;
  bool formattable_pointer_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_130;
  bool formattable_char_1;
  char *local_128 [3];
  undefined1 local_109;
  char *local_108;
  size_t local_100;
  undefined1 local_f3;
  undefined1 local_f2;
  undefined1 local_f1;
  bool formattable;
  bool formattable_pointer;
  v10 *pvStack_f0;
  bool formattable_char;
  char *local_e8 [7];
  v10 *local_b0;
  undefined1 *local_a8;
  basic_string_view<char> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  undefined1 *local_88;
  basic_string_view<char> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  undefined1 *local_68;
  basic_string_view<char> local_60;
  char **local_50;
  basic_string_view<char> local_48;
  char **local_38;
  basic_string_view<char> local_30;
  char **local_20;
  basic_string_view<char> local_18;
  
  local_f1 = 1;
  local_f2 = 1;
  local_f3 = 1;
  local_a8 = &local_109;
  pvStack_f0 = this;
  local_b0 = this;
  local_a0 = detail::to_string_view<char,std::char_traits<char>,std::allocator<char>>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  local_108 = local_a0.data_;
  local_100 = local_a0.size_;
  local_48.data_ = local_a0.data_;
  local_48.size_ = local_a0.size_;
  local_50 = local_e8;
  local_e8[0] = basic_string_view<char>::data(&local_48);
  sVar1 = basic_string_view<char>::size(&local_48);
  local_131 = 1;
  local_132 = 1;
  local_133 = 1;
  local_88 = &local_149;
  pbStack_130 = args;
  local_90 = args;
  local_80 = detail::to_string_view<char,std::char_traits<char>,std::allocator<char>>(args);
  local_148 = local_80.data_;
  local_140 = local_80.size_;
  local_30.data_ = local_80.data_;
  local_30.size_ = local_80.size_;
  local_38 = local_128;
  local_128[0] = basic_string_view<char>::data(&local_30);
  sVar2 = basic_string_view<char>::size(&local_30);
  local_171 = 1;
  local_172 = 1;
  local_173 = 1;
  local_68 = &local_189;
  pbStack_170 = args_1;
  local_70 = args_1;
  local_60 = detail::to_string_view<char,std::char_traits<char>,std::allocator<char>>(args_1);
  local_188 = local_60.data_;
  local_180 = local_60.size_;
  local_18.data_ = local_60.data_;
  local_18.size_ = local_60.size_;
  local_20 = local_168;
  local_168[0] = basic_string_view<char>::data(&local_18);
  sVar3 = basic_string_view<char>::size(&local_18);
  (__return_storage_ptr__->data_).args_[0].field_0.string.data = local_e8[0];
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = sVar1;
  (__return_storage_ptr__->data_).args_[1].field_0.string.data = local_128[0];
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = sVar2;
  (__return_storage_ptr__->data_).args_[2].field_0.string.data = local_168[0];
  (__return_storage_ptr__->data_).args_[2].field_0.string.size = sVar3;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}